

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

ram_addr_t find_ram_offset(uc_struct_conflict15 *uc,ram_addr_t size)

{
  ulong uVar1;
  ulong local_68;
  ulong local_60;
  ram_addr_t next;
  ram_addr_t candidate;
  ulong local_40;
  ram_addr_t mingap;
  ram_addr_t offset;
  RAMBlock *next_block;
  RAMBlock *block;
  ram_addr_t size_local;
  uc_struct_conflict15 *uc_local;
  
  mingap = 0xffffffffffffffff;
  local_40 = 0xffffffffffffffff;
  if (size == 0) {
    __assert_fail("size != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                  ,0x3d6,"ram_addr_t find_ram_offset(struct uc_struct *, ram_addr_t)");
  }
  if ((uc->ram_list).blocks.lh_first == (RAMBlock *)0x0) {
    uc_local = (uc_struct_conflict15 *)0x0;
  }
  else if (((uc->ram_list).freed & 1U) == 0) {
    uc_local = (uc_struct_conflict15 *)find_ram_offset_last(uc,size);
  }
  else {
    for (next_block = (uc->ram_list).blocks.lh_first; next_block != (RAMBlock *)0x0;
        next_block = (next_block->next).le_next) {
      local_60 = 0xffffffffffffffff;
      uVar1 = next_block->offset + next_block->max_length + 0xfffff & 0xfffffffffff00000;
      for (offset = (ram_addr_t)(uc->ram_list).blocks.lh_first; offset != 0;
          offset = *(ram_addr_t *)(offset + 0x30)) {
        if (uVar1 <= *(ulong *)(offset + 0x10)) {
          if (local_60 < *(ulong *)(offset + 0x10)) {
            local_68 = local_60;
          }
          else {
            local_68 = *(ulong *)(offset + 0x10);
          }
          local_60 = local_68;
        }
      }
      if ((size <= local_60 - uVar1) && (local_60 - uVar1 < local_40)) {
        local_40 = local_60 - uVar1;
        mingap = uVar1;
      }
    }
    if (mingap == 0xffffffffffffffff) {
      fprintf(_stderr,"Failed to find gap of requested size: %lu\n",size);
      abort();
    }
    uc_local = (uc_struct_conflict15 *)mingap;
  }
  return (ram_addr_t)uc_local;
}

Assistant:

static ram_addr_t find_ram_offset(struct uc_struct *uc, ram_addr_t size)
{
    RAMBlock *block, *next_block;
    ram_addr_t offset = RAM_ADDR_MAX, mingap = RAM_ADDR_MAX;

    assert(size != 0); /* it would hand out same offset multiple times */

    if (QLIST_EMPTY_RCU(&uc->ram_list.blocks)) {
        return 0;
    }

    if (!uc->ram_list.freed) {
        return find_ram_offset_last(uc, size);
    }

    RAMBLOCK_FOREACH(block) {
        ram_addr_t candidate, next = RAM_ADDR_MAX;

        /* Align blocks to start on a 'long' in the bitmap
         * which makes the bitmap sync'ing take the fast path.
         */
        candidate = block->offset + block->max_length;
        candidate = ROUND_UP(candidate, BITS_PER_LONG << TARGET_PAGE_BITS);

        /* Search for the closest following block
         * and find the gap.
         */
        RAMBLOCK_FOREACH(next_block) {
            if (next_block->offset >= candidate) {
                next = MIN(next, next_block->offset);
            }
        }

        /* If it fits remember our place and remember the size
         * of gap, but keep going so that we might find a smaller
         * gap to fill so avoiding fragmentation.
         */
        if (next - candidate >= size && next - candidate < mingap) {
            offset = candidate;
            mingap = next - candidate;
        }
    }

    if (offset == RAM_ADDR_MAX) {
        fprintf(stderr, "Failed to find gap of requested size: %" PRIu64 "\n",
                (uint64_t)size);
        abort();
    }

    return offset;
}